

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::setNewGeometry(QMdiSubWindowPrivate *this,QPoint *pos)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QWidget *this_00;
  OperationInfo *pOVar8;
  int *piVar9;
  uint *puVar10;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  int dy_1;
  int dx_1;
  int dy;
  int dx;
  bool restrictVertical;
  bool restrictHorizontal;
  uint cflags;
  QMdiSubWindow *q;
  QRect geometry;
  QRect parentRect;
  int posY;
  int posX;
  int in_stack_fffffffffffffeb8;
  SubWindowOption in_stack_fffffffffffffebc;
  uint w;
  undefined4 in_stack_fffffffffffffec0;
  uint cflags_00;
  uint in_stack_fffffffffffffec4;
  uint in_stack_fffffffffffffec8;
  uint cflags_01;
  uint in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  uint in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined1 local_28 [16];
  int local_18;
  uint local_14;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &q_func(in_RDI)->super_QWidget;
  local_10._M_node =
       (_Base_ptr)
       QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::find
                 ((QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *)
                  CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                  (Operation *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  pOVar8 = QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::iterator::
           value((iterator *)0x62fcd6);
  cflags_01 = pOVar8->changeFlags;
  local_14 = QPoint::x((QPoint *)0x62fcec);
  local_18 = QPoint::y((QPoint *)0x62fd00);
  bVar1 = QMdiSubWindow::testOption
                    ((QMdiSubWindow *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffebc);
  bVar2 = (bVar1 ^ 0xffU) & 1;
  bVar1 = QMdiSubWindow::testOption
                    ((QMdiSubWindow *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffebc);
  bVar3 = (bVar1 ^ 0xffU) & 1;
  if ((bVar2 != 0) || (bVar3 != 0)) {
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QWidget::parentWidget((QWidget *)0x62fd84);
    local_28 = (undefined1  [16])
               QWidget::rect((QWidget *)
                             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if ((bVar3 != 0) && (((cflags_01 & 0x20) != 0 || (in_RDI->currentOperation == Move)))) {
      iVar4 = QPoint::y((QPoint *)0x62fddc);
      local_2c = QRect::y((QRect *)0x62fdf1);
      local_2c = iVar4 - local_2c;
      piVar9 = qMax<int>(&local_2c,&local_18);
      local_30 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8
                                                ));
      local_30 = local_30 + -5;
      piVar9 = qMin<int>(piVar9,&local_30);
      local_18 = *piVar9;
    }
    if (in_RDI->currentOperation == Move) {
      if (bVar2 != 0) {
        piVar9 = qMax<int>(&BoundaryMargin,(int *)&local_14);
        local_34 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffebc,
                                                  in_stack_fffffffffffffeb8));
        local_34 = local_34 + -5;
        puVar10 = (uint *)qMin<int>(piVar9,&local_34);
        local_14 = *puVar10;
      }
      if (bVar3 != 0) {
        local_38 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffebc,
                                                   in_stack_fffffffffffffeb8));
        local_38 = local_38 + -5;
        piVar9 = qMin<int>(&local_18,&local_38);
        local_18 = *piVar9;
      }
    }
    else {
      if (bVar2 != 0) {
        if ((cflags_01 & 0x10) == 0) {
          iVar4 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8
                                                ));
          iVar7 = QRect::x((QRect *)0x62ff8e);
          iVar5 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8
                                                ));
          iVar6 = QPoint::x((QPoint *)0x62ffc0);
          local_40 = iVar4 - ((iVar7 + iVar5) - iVar6);
          puVar10 = (uint *)qMin<int>(&local_40,(int *)&local_14);
          local_14 = *puVar10;
        }
        else {
          iVar4 = QPoint::x((QPoint *)0x62ff25);
          local_3c = QRect::x((QRect *)0x62ff3a);
          local_3c = iVar4 - local_3c;
          puVar10 = (uint *)qMax<int>(&local_3c,(int *)&local_14);
          local_14 = *puVar10;
        }
      }
      if ((bVar3 != 0) && ((cflags_01 & 0x20) == 0)) {
        iVar4 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                             );
        iVar7 = QRect::y((QRect *)0x630038);
        iVar5 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                             );
        iVar6 = QPoint::y((QPoint *)0x63006a);
        local_44 = iVar4 - ((iVar7 + iVar5) - iVar6);
        piVar9 = qMin<int>(&local_44,&local_18);
        local_18 = *piVar9;
      }
    }
  }
  QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  if ((cflags_01 & 3) == 0) {
    QWidget::geometry(this_00);
    QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QRect::setTopLeft((QRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                      (QPoint *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  }
  else {
    in_stack_fffffffffffffecc = local_14;
    in_stack_fffffffffffffed8 = cflags_01;
    in_stack_fffffffffffffedc = QPoint::x((QPoint *)0x630106);
    in_stack_fffffffffffffedc = in_stack_fffffffffffffecc - in_stack_fffffffffffffedc;
    in_stack_fffffffffffffed0 =
         QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QSize::width((QSize *)0x630138);
    in_stack_fffffffffffffed4 =
         QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QWidget::maximumWidth((QWidget *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    getMoveDeltaComponent
              (in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
               in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
    QPoint::y((QPoint *)0x6301b8);
    QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QSize::height((QSize *)0x6301ea);
    QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QWidget::maximumHeight((QWidget *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0))
    ;
    getMoveDeltaComponent
              (in_stack_fffffffffffffecc,in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
               in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
    QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
    ::operator+((QPoint *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                (QPoint *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    QRect::setTopLeft((QRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                      (QPoint *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  }
  if ((cflags_01 & 0xc) == 0) {
    QWidget::geometry(this_00);
    QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    QRect::setSize((QRect *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   (QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  }
  else {
    w = local_14;
    cflags_00 = cflags_01;
    iVar4 = QPoint::x((QPoint *)0x630317);
    getResizeDeltaComponent(cflags_00,4,0x10,w - iVar4);
    iVar4 = local_18;
    iVar7 = QPoint::y((QPoint *)0x63035e);
    getResizeDeltaComponent(cflags_01,8,0x20,iVar4 - iVar7);
    QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    QSize::QSize((QSize *)CONCAT44(iVar4,cflags_00),w,in_stack_fffffffffffffeb8);
    ::operator+((QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                (QSize *)CONCAT44(in_stack_fffffffffffffecc,cflags_01));
    QRect::setSize((QRect *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   (QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  }
  setNewGeometry((QMdiSubWindowPrivate *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 (QRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::setNewGeometry(const QPoint &pos)
{
    Q_Q(QMdiSubWindow);
    Q_ASSERT(currentOperation != None);
    Q_ASSERT(parent);

    uint cflags = operationMap.find(currentOperation).value().changeFlags;
    int posX = pos.x();
    int posY = pos.y();

    const bool restrictHorizontal = !q->testOption(QMdiSubWindow::AllowOutsideAreaHorizontally);
    const bool restrictVertical = !q->testOption(QMdiSubWindow::AllowOutsideAreaVertically);

    if (restrictHorizontal || restrictVertical) {
        QRect parentRect = q->parentWidget()->rect();
        if (restrictVertical && (cflags & VResizeReverse || currentOperation == Move)) {
            posY = qMin(qMax(mousePressPosition.y() - oldGeometry.y(), posY),
                        parentRect.height() - BoundaryMargin);
        }
        if (currentOperation == Move) {
            if (restrictHorizontal)
                posX = qMin(qMax(BoundaryMargin, posX), parentRect.width() - BoundaryMargin);
            if (restrictVertical)
                posY = qMin(posY, parentRect.height() - BoundaryMargin);
        } else {
            if (restrictHorizontal) {
                if (cflags & HResizeReverse)
                    posX = qMax(mousePressPosition.x() - oldGeometry.x(), posX);
                else
                    posX = qMin(parentRect.width() - (oldGeometry.x() + oldGeometry.width()
                                                      - mousePressPosition.x()), posX);
            }
            if (restrictVertical && !(cflags & VResizeReverse)) {
                posY = qMin(parentRect.height() - (oldGeometry.y() + oldGeometry.height()
                                                   - mousePressPosition.y()), posY);
            }
        }
    }

    QRect geometry;
    if (cflags & (HMove | VMove)) {
        int dx = getMoveDeltaComponent(cflags, HMove, HResize, posX - mousePressPosition.x(),
                                       oldGeometry.width() - internalMinimumSize.width(),
                                       oldGeometry.width() - q->maximumWidth());
        int dy = getMoveDeltaComponent(cflags, VMove, VResize, posY - mousePressPosition.y(),
                                       oldGeometry.height() - internalMinimumSize.height(),
                                       oldGeometry.height() - q->maximumHeight());
        geometry.setTopLeft(oldGeometry.topLeft() + QPoint(dx, dy));
    } else {
        geometry.setTopLeft(q->geometry().topLeft());
    }

    if (cflags & (HResize | VResize)) {
        int dx = getResizeDeltaComponent(cflags, HResize, HResizeReverse,
                                         posX - mousePressPosition.x());
        int dy = getResizeDeltaComponent(cflags, VResize, VResizeReverse,
                                         posY - mousePressPosition.y());
        geometry.setSize(oldGeometry.size() + QSize(dx, dy));
    } else {
        geometry.setSize(q->geometry().size());
    }

    setNewGeometry(&geometry);
}